

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ParseStageMetas(AsciiParser *this)

{
  bool bVar1;
  bool bVar2;
  StreamReader *pSVar3;
  ulong uVar4;
  char c;
  char local_19;
  
  bVar1 = Expect(this,'(');
  if ((bVar1) && (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), bVar1)) {
    pSVar3 = this->_sr;
    uVar4 = pSVar3->idx_;
    bVar1 = true;
    if (uVar4 < pSVar3->length_) {
      do {
        if (pSVar3->binary_[uVar4] == '\0') {
          return true;
        }
        bVar2 = LookChar1(this,&local_19);
        if (!bVar2) goto LAB_00368531;
        if (local_19 == ')') {
          pSVar3 = this->_sr;
          uVar4 = pSVar3->idx_ + 1;
          if (uVar4 <= pSVar3->length_) {
            pSVar3->idx_ = uVar4;
            bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
            return bVar1;
          }
          goto LAB_00368531;
        }
        bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (((!bVar2) || (bVar2 = ParseStageMetaOpt(this), !bVar2)) ||
           (bVar2 = SkipCommentAndWhitespaceAndNewline(this,true), !bVar2)) goto LAB_00368531;
        pSVar3 = this->_sr;
        uVar4 = pSVar3->idx_;
      } while (uVar4 < pSVar3->length_);
    }
  }
  else {
LAB_00368531:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ParseStageMetas() {
  if (!Expect('(')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == ')') {
      if (!SeekTo(CurrLoc() + 1)) {
        return false;
      }

      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      DCOUT("Stage metas end");

      // end
      return true;

    } else {
      if (!SkipCommentAndWhitespaceAndNewline()) {
        // eof
        return false;
      }

      if (!ParseStageMetaOpt()) {
        // parse error
        return false;
      }
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }
  }

  DCOUT("ParseStageMetas end");
  return true;
}